

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::VerifyUpdateConstraints
          (DataTable *this,ConstraintState *state,ClientContext *context,DataChunk *chunk,
          vector<duckdb::PhysicalIndex,_true> *column_ids)

{
  ConstraintType CVar1;
  TableCatalogEntry *table;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *this_01;
  const_reference this_02;
  const_reference this_03;
  pointer pBVar2;
  BoundNotNullConstraint *pBVar3;
  pointer pCVar4;
  const_reference pvVar5;
  BoundCheckConstraint *pBVar6;
  iterator iVar7;
  reference other;
  type expr;
  ColumnDefinition *this_04;
  reference pvVar8;
  string *col_name;
  NotImplementedException *this_05;
  InternalException *this_06;
  size_type sVar9;
  column_t i;
  column_t i_1;
  ulong uVar10;
  ulong __n;
  allocator local_c1;
  BoundCheckConstraint *local_c0;
  TableCatalogEntry *local_b8;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *local_b0;
  ClientContext *local_a8;
  CheckConstraint *local_a0;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  *local_98;
  string local_90;
  DataChunk mock_chunk;
  
  local_b8 = state->table;
  local_a8 = context;
  this_01 = TableCatalogEntry::GetConstraints(local_b8);
  local_98 = state->bound_constraints;
  __n = 0;
  local_b0 = this_01;
  do {
    this_00 = local_98;
    if ((ulong)((long)(local_98->
                      super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_98->
                      super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      return;
    }
    this_02 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
              ::get<true>(this_01,__n);
    this_03 = vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              ::get<true>(this_00,__n);
    pBVar2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
             ::operator->(this_03);
    CVar1 = pBVar2->type;
    if (1 < CVar1 - 3) {
      if (CVar1 == CHECK) {
        pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_02);
        local_a0 = Constraint::Cast<duckdb::CheckConstraint>(pCVar4);
        pBVar2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                 ::operator->(this_03);
        pBVar6 = BoundConstraint::Cast<duckdb::BoundCheckConstraint>(pBVar2);
        DataChunk::DataChunk(&mock_chunk);
        sVar9 = 0;
        local_c0 = pBVar6;
        for (uVar10 = 0;
            uVar10 < (ulong)((long)(column_ids->
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ).
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(column_ids->
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ).
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar10 = uVar10 + 1) {
          pvVar5 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids,uVar10);
          iVar7 = ::std::
                  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&(pBVar6->bound_columns)._M_h,pvVar5);
          sVar9 = (sVar9 + 1) -
                  (ulong)(iVar7.super__Node_iterator_base<duckdb::PhysicalIndex,_true>._M_cur ==
                         (__node_type *)0x0);
        }
        if (sVar9 != 0) {
          if (sVar9 != (local_c0->bound_columns)._M_h._M_element_count) {
            this_06 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_90,
                       "Not all columns required for the CHECK constraint are present in the UPDATED chunk!"
                       ,&local_c1);
            InternalException::InternalException(this_06,&local_90);
            __cxa_throw(this_06,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)&local_90,local_b8);
          DataChunk::InitializeEmpty(&mock_chunk,(vector<duckdb::LogicalType,_true> *)&local_90);
          for (uVar10 = 0;
              uVar10 < (ulong)((long)(column_ids->
                                     super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     ).
                                     super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(column_ids->
                                     super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     ).
                                     super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar10 = uVar10 + 1) {
            pvVar5 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids,uVar10);
            pvVar8 = vector<duckdb::Vector,_true>::get<true>(&mock_chunk.data,pvVar5->index);
            other = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar10);
            Vector::Reference(pvVar8,other);
          }
          mock_chunk.count = chunk->count;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_90)
          ;
          expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_c0->expression);
          VerifyCheckConstraint(local_a8,local_b8,expr,&mock_chunk,local_a0);
        }
        DataChunk::~DataChunk(&mock_chunk);
        this_01 = local_b0;
      }
      else {
        if (CVar1 != NOT_NULL) {
          this_05 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&mock_chunk,"Constraint type not implemented!",(allocator *)&local_90
                    );
          NotImplementedException::NotImplementedException(this_05,(string *)&mock_chunk);
          __cxa_throw(this_05,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        pBVar2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                 ::operator->(this_03);
        pBVar3 = BoundConstraint::Cast<duckdb::BoundNotNullConstraint>(pBVar2);
        pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_02);
        local_c0 = (BoundCheckConstraint *)Constraint::Cast<duckdb::NotNullConstraint>(pCVar4);
        for (uVar10 = 0;
            uVar10 < (ulong)((long)(column_ids->
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ).
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(column_ids->
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ).
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar10 = uVar10 + 1) {
          pvVar5 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids,uVar10);
          table = local_b8;
          if (pvVar5->index == (pBVar3->index).index) {
            this_04 = TableCatalogEntry::GetColumn
                                (local_b8,(LogicalIndex)
                                          ((LogicalIndex *)&local_c0->expression)->index);
            pvVar8 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar10);
            local_c0 = (BoundCheckConstraint *)chunk->count;
            col_name = ColumnDefinition::Name_abi_cxx11_(this_04);
            this_01 = local_b0;
            VerifyNotNullConstraint(table,pvVar8,(idx_t)local_c0,col_name);
            break;
          }
        }
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void DataTable::VerifyUpdateConstraints(ConstraintState &state, ClientContext &context, DataChunk &chunk,
                                        const vector<PhysicalIndex> &column_ids) {
	auto &table = state.table;
	auto &constraints = table.GetConstraints();
	auto &bound_constraints = state.bound_constraints;
	for (idx_t constr_idx = 0; constr_idx < bound_constraints.size(); constr_idx++) {
		auto &base_constraint = constraints[constr_idx];
		auto &constraint = bound_constraints[constr_idx];
		switch (constraint->type) {
		case ConstraintType::NOT_NULL: {
			auto &bound_not_null = constraint->Cast<BoundNotNullConstraint>();
			auto &not_null = base_constraint->Cast<NotNullConstraint>();
			// check if the constraint is in the list of column_ids
			for (idx_t col_idx = 0; col_idx < column_ids.size(); col_idx++) {
				if (column_ids[col_idx] == bound_not_null.index) {
					// found the column id: check the data in
					auto &col = table.GetColumn(LogicalIndex(not_null.index));
					VerifyNotNullConstraint(table, chunk.data[col_idx], chunk.size(), col.Name());
					break;
				}
			}
			break;
		}
		case ConstraintType::CHECK: {
			auto &check = base_constraint->Cast<CheckConstraint>();
			auto &bound_check = constraint->Cast<BoundCheckConstraint>();

			DataChunk mock_chunk;
			if (CreateMockChunk(table, column_ids, bound_check.bound_columns, chunk, mock_chunk)) {
				VerifyCheckConstraint(context, table, *bound_check.expression, mock_chunk, check);
			}
			break;
		}
		case ConstraintType::UNIQUE:
		case ConstraintType::FOREIGN_KEY:
			break;
		default:
			throw NotImplementedException("Constraint type not implemented!");
		}
	}

#ifdef DEBUG
	// Ensure that we never call UPDATE for indexed columns.
	// Instead, we must rewrite these updates into DELETE + INSERT.
	info->indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		D_ASSERT(!index.Cast<BoundIndex>().IndexIsUpdated(column_ids));
		return false;
	});
#endif
}